

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O2

void __thiscall
test::iu_FilePath_x_iutest_x_GetExtention_Test::Body(iu_FilePath_x_iutest_x_GetExtention_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  AssertionResult local_208;
  iuFilePath local_1e0;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::detail::iuFilePath::iuFilePath(&local_1e0);
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_((string *)&local_190,&local_1e0);
  iutest::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (&local_208,(internal *)"\"\"","path.GetExtension()","",(char (*) [1])&local_190,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x97,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"test.exe");
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_((string *)&local_190,&local_1e0);
  iutest::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (&local_208,(internal *)"\".exe\"","path.GetExtension()",".exe",(char (*) [5])&local_190
             ,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x9b,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  iutest::detail::iuFilePath::iuFilePath(&local_1e0,"test.exe.txt");
  iutest::detail::iuFilePath::GetExtension_abi_cxx11_((string *)&local_190,&local_1e0);
  iutest::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            (&local_208,(internal *)"\".txt\"","path.GetExtension()",".txt",(char (*) [5])&local_190
             ,in_R9);
  std::__cxx11::string::~string((string *)&local_190);
  if (local_208.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0x9f,local_208.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e0);
  return;
}

Assistant:

IUTEST(FilePath, GetExtention)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_EQ("", path.GetExtension());
    }
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ(".exe", path.GetExtension());
    }
    {
        ::iutest::internal::FilePath path("test.exe.txt");
        IUTEST_EXPECT_EQ(".txt", path.GetExtension());
    }
}